

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_14174cb::SADSkipTest_UnalignedRef_Test::~SADSkipTest_UnalignedRef_Test
          (SADSkipTest_UnalignedRef_Test *this)

{
  void *in_RDI;
  
  ~SADSkipTest_UnalignedRef_Test((SADSkipTest_UnalignedRef_Test *)0xc31708);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST_P(SADSkipTest, UnalignedRef) {
  // The reference frame, but not the source frame, may be unaligned for
  // certain types of searches.
  const int tmp_stride = reference_stride_;
  reference_stride_ -= 1;
  FillRandom(source_data_, source_stride_);
  FillRandom(reference_data_, reference_stride_);
  CheckSAD();
  reference_stride_ = tmp_stride;
}